

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fail_function.hpp
# Opt level: O2

bool __thiscall
boost::spirit::karma::detail::
fail_function<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type>
::operator()(fail_function<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type>
             *this,action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<16>,_(boost::spirit::endian::endianness)0,_16>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::argument<0>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_short>_>,_0L>_>_>,_2L>_>_>
                   *component)

{
  bool bVar1;
  
  bVar1 = action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::argument<0>>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_short>>,0l>>>,2l>>>
          ::
          generate<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::spirit::unused_type>
                    ((action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::argument<0>>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_short>>,0l>>>,2l>>>
                      *)component,
                     *(output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
                       **)this,*(unused_type **)(this + 8),*(unused_type **)(this + 0x10),
                     (unused_type *)&unused);
  return !bVar1;
}

Assistant:

bool operator()(Component const& component) const
        {
#if BOOST_WORKAROUND(BOOST_MSVC, BOOST_TESTED_AT(1600))  
            component; // suppresses warning: C4100: 'component' : unreferenced formal parameter
#endif
            // return true if any of the generators fail
            return !component.generate(sink, ctx, delim, unused);
        }